

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O2

qsizetype QtPrivate::findByteArray(QByteArrayView haystack,qsizetype from,QByteArrayView needle)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __needlelen;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = haystack.m_size;
  __needlelen = needle.m_size;
  uVar5 = (from >> 0x3f & uVar4) + from;
  uVar2 = 0xffffffffffffffff;
  uVar3 = uVar2;
  if ((uVar5 + __needlelen <= uVar4) && (uVar3 = uVar5, __needlelen != 0)) {
    if (uVar4 != 0) {
      pvVar1 = memmem(haystack.m_data + uVar5,uVar4 - uVar5,needle.m_data,__needlelen);
      uVar2 = -(ulong)(pvVar1 == (void *)0x0) | (long)pvVar1 - (long)haystack.m_data;
    }
    return uVar2;
  }
  return uVar3;
}

Assistant:

qsizetype QtPrivate::findByteArray(QByteArrayView haystack, qsizetype from, QByteArrayView needle) noexcept
{
    const auto haystack0 = haystack.data();
    const auto l = haystack.size();
    const auto sl = needle.size();
#if !QT_CONFIG(memmem)
    if (sl == 1)
        return findByteArray(haystack, from, needle.front());
#endif

    if (from < 0)
        from += l;
    if (std::size_t(sl + from) > std::size_t(l))
        return -1;
    if (!sl)
        return from;
    if (!l)
        return -1;

#if QT_CONFIG(memmem)
    auto where = memmem(haystack0 + from, l - from, needle.data(), sl);
    return where ? static_cast<const char *>(where) - haystack0 : -1;
#endif

    /*
      We use the Boyer-Moore algorithm in cases where the overhead
      for the skip table should pay off, otherwise we use a simple
      hash function.
    */
    if (l > 500 && sl > 5)
        return qFindByteArrayBoyerMoore(haystack0, l, from, needle.data(), sl);
    return qFindByteArray(haystack0, l, from, needle.data(), sl);
}